

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3ExprCodeIN(Parse *pParse,Expr *pExpr,int destIfFalse,int destIfNull)

{
  Expr *p;
  Vdbe *p_00;
  ExprList *pEVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int addr;
  int iVar7;
  int iVar8;
  Select *pSVar9;
  int *aiMap;
  Expr *pEVar10;
  CollSeq *zP4;
  u8 uVar11;
  int *prRhsHasNull;
  Op *pOVar12;
  long lVar13;
  ulong uVar14;
  ExprList_item *pEVar15;
  uint uVar16;
  int iVar17;
  uint i;
  int iTab;
  int rRhsHasNull;
  int regToFree;
  int iDummy;
  int local_6c;
  int local_5c;
  int *local_58;
  CollSeq *local_50;
  int local_44;
  byte *local_40;
  int local_38;
  int local_34;
  
  local_44 = 0;
  local_5c = 0;
  p = pExpr->pLeft;
  iVar3 = sqlite3ExprCheckIN(pParse,pExpr);
  if (iVar3 != 0) {
    return;
  }
  local_40 = (byte *)exprINAffinity(pParse,pExpr);
  pEVar10 = pExpr->pLeft;
  uVar11 = pEVar10->op;
  if (uVar11 == 0xa8) {
    uVar11 = pEVar10->op2;
  }
  if (uVar11 == 0x83) {
    pSVar9 = (pEVar10->x).pSelect;
LAB_0016c84b:
    uVar16 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar9->pEList)->pList->nExpr;
  }
  else {
    uVar16 = 1;
    if (uVar11 == 0xa9) {
      pSVar9 = (Select *)&pEVar10->x;
      goto LAB_0016c84b;
    }
  }
  aiMap = (int *)sqlite3DbMallocZero(pParse->db,(long)(int)uVar16 * 5 + 1);
  if (pParse->db->mallocFailed != '\0') goto LAB_0016cf20;
  p_00 = pParse->pVdbe;
  prRhsHasNull = &local_44;
  if (destIfFalse == destIfNull) {
    prRhsHasNull = (int *)0x0;
  }
  local_58 = aiMap;
  iVar4 = sqlite3FindInIndex(pParse,pExpr,3,prRhsHasNull,aiMap,&local_5c);
  iVar5 = exprCodeVector(pParse,p,&local_34);
  local_50 = (CollSeq *)CONCAT44(local_50._4_4_,uVar16);
  iVar3 = iVar5;
  if ((int)uVar16 < 1) {
    if (uVar16 != 0) {
      iVar3 = sqlite3GetTempRange(pParse,uVar16);
    }
  }
  else {
    uVar14 = 0;
    do {
      if (uVar14 != (uint)local_58[uVar14]) {
        if ((uVar16 != (uint)uVar14) &&
           (iVar3 = sqlite3GetTempRange(pParse,uVar16), 0 < (int)uVar16)) {
          uVar14 = 0;
          do {
            sqlite3VdbeAddOp3(p_00,0x4e,iVar5 + (int)uVar14,local_58[uVar14] + iVar3,0);
            uVar14 = uVar14 + 1;
          } while (uVar16 != uVar14);
          uVar16 = (uint)local_50;
        }
        break;
      }
      uVar14 = uVar14 + 1;
    } while (uVar16 != uVar14);
  }
  if (iVar4 == 5) {
    pEVar1 = (pExpr->x).pList;
    local_50 = sqlite3ExprCollSeq(pParse,pExpr->pLeft);
    iVar6 = pParse->nLabel + -1;
    iVar4 = 0;
    pParse->nLabel = iVar6;
    if (destIfFalse != destIfNull) {
      if (pParse->nTempReg == '\0') {
        iVar4 = pParse->nMem + 1;
        pParse->nMem = iVar4;
      }
      else {
        bVar2 = pParse->nTempReg - 1;
        pParse->nTempReg = bVar2;
        iVar4 = pParse->aTempReg[bVar2];
      }
      sqlite3VdbeAddOp3(p_00,0x60,iVar3,iVar3,iVar4);
    }
    if (0 < pEVar1->nExpr) {
      pEVar15 = pEVar1->a;
      lVar13 = 0;
      do {
        iVar7 = sqlite3ExprCodeTemp(pParse,pEVar15->pExpr,&local_38);
        if ((iVar4 != 0) && (iVar8 = sqlite3ExprCanBeNull(pEVar15->pExpr), iVar8 != 0)) {
          sqlite3VdbeAddOp3(p_00,0x60,iVar4,iVar7,iVar4);
        }
        if ((destIfFalse == destIfNull) && ((long)pEVar1->nExpr + -1 <= lVar13)) {
          iVar7 = sqlite3VdbeAddOp3(p_00,0x34,iVar3,destIfFalse,iVar7);
          sqlite3VdbeChangeP4(p_00,iVar7,(char *)local_50,-2);
          uVar16 = p_00->nOp;
          if (0 < (int)uVar16) {
            bVar2 = *local_40 | 0x10;
LAB_0016cdd9:
            p_00->aOp[(ulong)uVar16 - 1].p5 = (short)(char)bVar2;
          }
        }
        else {
          iVar7 = sqlite3VdbeAddOp3(p_00,0x35,iVar3,iVar6,iVar7);
          sqlite3VdbeChangeP4(p_00,iVar7,(char *)local_50,-2);
          uVar16 = p_00->nOp;
          if (0 < (int)uVar16) {
            bVar2 = *local_40;
            goto LAB_0016cdd9;
          }
        }
        if (local_38 != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = local_38;
          }
        }
        lVar13 = lVar13 + 1;
        pEVar15 = pEVar15 + 1;
      } while (lVar13 < pEVar1->nExpr);
    }
    if (iVar4 == 0) {
      sqlite3VdbeResolveLabel(p_00,iVar6);
    }
    else {
      sqlite3VdbeAddOp3(p_00,0x32,iVar4,destIfNull,0);
      sqlite3VdbeAddOp3(p_00,0xb,0,destIfFalse,0);
      sqlite3VdbeResolveLabel(p_00,iVar6);
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = iVar4;
      }
    }
  }
  else {
    iVar6 = destIfFalse;
    iVar7 = 0;
    if (destIfFalse != destIfNull) {
      iVar6 = pParse->nLabel + -1;
      pParse->nLabel = iVar6;
      iVar7 = iVar6;
    }
    if (0 < (int)uVar16) {
      i = 0;
      do {
        pEVar10 = sqlite3VectorFieldSubexpr(pExpr->pLeft,i);
        iVar8 = sqlite3ExprCanBeNull(pEVar10);
        if (iVar8 != 0) {
          sqlite3VdbeAddOp3(p_00,0x32,iVar3 + i,iVar6,0);
        }
        i = i + 1;
      } while (uVar16 != i);
    }
    iVar6 = local_5c;
    if (iVar4 == 1) {
      sqlite3VdbeAddOp3(p_00,0x1e,local_5c,destIfFalse,iVar3);
      local_6c = sqlite3VdbeAddOp3(p_00,0xb,0,0,0);
    }
    else {
      iVar4 = sqlite3VdbeAddOp3(p_00,0x5b,iVar3,uVar16,0);
      sqlite3VdbeChangeP4(p_00,iVar4,(char *)local_40,uVar16);
      iVar6 = local_5c;
      if (destIfFalse == destIfNull) {
        iVar4 = sqlite3VdbeAddOp3(p_00,0x1c,local_5c,destIfFalse,iVar3);
        if (p_00->db->mallocFailed == '\0') {
          pOVar12 = p_00->aOp;
          pOVar12[iVar4].p4type = -3;
          pOVar12[iVar4].p4.i = uVar16;
        }
        goto LAB_0016cef8;
      }
      local_6c = sqlite3VdbeAddOp3(p_00,0x1d,local_5c,0,iVar3);
      if (p_00->db->mallocFailed == '\0') {
        pOVar12 = p_00->aOp;
        pOVar12[local_6c].p4type = -3;
        pOVar12[local_6c].p4.i = uVar16;
      }
    }
    if (uVar16 == 1 && local_44 != 0) {
      sqlite3VdbeAddOp3(p_00,0x33,local_44,destIfFalse,0);
    }
    if (destIfFalse == destIfNull) {
      sqlite3VdbeAddOp3(p_00,0xb,0,destIfFalse,0);
    }
    if (iVar7 != 0) {
      sqlite3VdbeResolveLabel(p_00,iVar7);
    }
    iVar4 = sqlite3VdbeAddOp3(p_00,0x24,iVar6,destIfFalse,0);
    if ((int)uVar16 < 2) {
      iVar7 = destIfFalse;
      if (0 < (int)uVar16) goto LAB_0016cb82;
LAB_0016cea1:
      sqlite3VdbeAddOp3(p_00,0xb,0,destIfNull,0);
    }
    else {
      iVar7 = pParse->nLabel + -1;
      pParse->nLabel = iVar7;
LAB_0016cb82:
      iVar8 = 0;
      do {
        if (pParse->nTempReg == '\0') {
          iVar17 = pParse->nMem + 1;
          pParse->nMem = iVar17;
        }
        else {
          bVar2 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar2;
          iVar17 = pParse->aTempReg[bVar2];
        }
        pEVar10 = sqlite3VectorFieldSubexpr(p,iVar8);
        zP4 = sqlite3ExprCollSeq(pParse,pEVar10);
        sqlite3VdbeAddOp3(p_00,0x5a,iVar6,iVar8,iVar17);
        addr = sqlite3VdbeAddOp3(p_00,0x34,iVar3 + iVar8,iVar7,iVar17);
        sqlite3VdbeChangeP4(p_00,addr,(char *)zP4,-2);
        if (iVar17 != 0) {
          bVar2 = pParse->nTempReg;
          if ((ulong)bVar2 < 8) {
            pParse->nTempReg = bVar2 + 1;
            pParse->aTempReg[bVar2] = iVar17;
          }
        }
        iVar8 = iVar8 + 1;
        iVar17 = (uint)local_50;
      } while ((uint)local_50 != iVar8);
      sqlite3VdbeAddOp3(p_00,0xb,0,destIfNull,0);
      if (1 < iVar17) {
        sqlite3VdbeResolveLabel(p_00,iVar7);
        sqlite3VdbeAddOp3(p_00,5,iVar6,iVar4 + 1,0);
        destIfNull = destIfFalse;
        goto LAB_0016cea1;
      }
    }
    if (p_00->db->mallocFailed == '\0') {
      iVar4 = p_00->nOp + -1;
      if (-1 < local_6c) {
        iVar4 = local_6c;
      }
      pOVar12 = p_00->aOp + iVar4;
    }
    else {
      pOVar12 = (Op *)&sqlite3VdbeGetOp_dummy;
    }
    pOVar12->p2 = p_00->nOp;
  }
LAB_0016cef8:
  aiMap = local_58;
  if (iVar3 != 0 && iVar3 != iVar5) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = iVar3;
    }
  }
LAB_0016cf20:
  if (aiMap != (int *)0x0) {
    sqlite3DbFreeNN(pParse->db,aiMap);
  }
  if (local_40 != (byte *)0x0) {
    sqlite3DbFreeNN(pParse->db,local_40);
  }
  return;
}

Assistant:

static void sqlite3ExprCodeIN(
  Parse *pParse,        /* Parsing and code generating context */
  Expr *pExpr,          /* The IN expression */
  int destIfFalse,      /* Jump here if LHS is not contained in the RHS */
  int destIfNull        /* Jump here if the results are unknown due to NULLs */
){
  int rRhsHasNull = 0;  /* Register that is true if RHS contains NULL values */
  int eType;            /* Type of the RHS */
  int rLhs;             /* Register(s) holding the LHS values */
  int rLhsOrig;         /* LHS values prior to reordering by aiMap[] */
  Vdbe *v;              /* Statement under construction */
  int *aiMap = 0;       /* Map from vector field to index column */
  char *zAff = 0;       /* Affinity string for comparisons */
  int nVector;          /* Size of vectors for this IN operator */
  int iDummy;           /* Dummy parameter to exprCodeVector() */
  Expr *pLeft;          /* The LHS of the IN operator */
  int i;                /* loop counter */
  int destStep2;        /* Where to jump when NULLs seen in step 2 */
  int destStep6 = 0;    /* Start of code for Step 6 */
  int addrTruthOp;      /* Address of opcode that determines the IN is true */
  int destNotNull;      /* Jump here if a comparison is not true in step 6 */
  int addrTop;          /* Top of the step-6 loop */ 
  int iTab = 0;         /* Index to use */

  pLeft = pExpr->pLeft;
  if( sqlite3ExprCheckIN(pParse, pExpr) ) return;
  zAff = exprINAffinity(pParse, pExpr);
  nVector = sqlite3ExprVectorSize(pExpr->pLeft);
  aiMap = (int*)sqlite3DbMallocZero(
      pParse->db, nVector*(sizeof(int) + sizeof(char)) + 1
  );
  if( pParse->db->mallocFailed ) goto sqlite3ExprCodeIN_oom_error;

  /* Attempt to compute the RHS. After this step, if anything other than
  ** IN_INDEX_NOOP is returned, the table opened with cursor iTab
  ** contains the values that make up the RHS. If IN_INDEX_NOOP is returned,
  ** the RHS has not yet been coded.  */
  v = pParse->pVdbe;
  assert( v!=0 );       /* OOM detected prior to this routine */
  VdbeNoopComment((v, "begin IN expr"));
  eType = sqlite3FindInIndex(pParse, pExpr,
                             IN_INDEX_MEMBERSHIP | IN_INDEX_NOOP_OK,
                             destIfFalse==destIfNull ? 0 : &rRhsHasNull,
                             aiMap, &iTab);

  assert( pParse->nErr || nVector==1 || eType==IN_INDEX_EPH
       || eType==IN_INDEX_INDEX_ASC || eType==IN_INDEX_INDEX_DESC 
  );
#ifdef SQLITE_DEBUG
  /* Confirm that aiMap[] contains nVector integer values between 0 and
  ** nVector-1. */
  for(i=0; i<nVector; i++){
    int j, cnt;
    for(cnt=j=0; j<nVector; j++) if( aiMap[j]==i ) cnt++;
    assert( cnt==1 );
  }
#endif

  /* Code the LHS, the <expr> from "<expr> IN (...)". If the LHS is a 
  ** vector, then it is stored in an array of nVector registers starting 
  ** at r1.
  **
  ** sqlite3FindInIndex() might have reordered the fields of the LHS vector
  ** so that the fields are in the same order as an existing index.   The
  ** aiMap[] array contains a mapping from the original LHS field order to
  ** the field order that matches the RHS index.
  */
  rLhsOrig = exprCodeVector(pParse, pLeft, &iDummy);
  for(i=0; i<nVector && aiMap[i]==i; i++){} /* Are LHS fields reordered? */
  if( i==nVector ){
    /* LHS fields are not reordered */
    rLhs = rLhsOrig;
  }else{
    /* Need to reorder the LHS fields according to aiMap */
    rLhs = sqlite3GetTempRange(pParse, nVector);
    for(i=0; i<nVector; i++){
      sqlite3VdbeAddOp3(v, OP_Copy, rLhsOrig+i, rLhs+aiMap[i], 0);
    }
  }

  /* If sqlite3FindInIndex() did not find or create an index that is
  ** suitable for evaluating the IN operator, then evaluate using a
  ** sequence of comparisons.
  **
  ** This is step (1) in the in-operator.md optimized algorithm.
  */
  if( eType==IN_INDEX_NOOP ){
    ExprList *pList = pExpr->x.pList;
    CollSeq *pColl = sqlite3ExprCollSeq(pParse, pExpr->pLeft);
    int labelOk = sqlite3VdbeMakeLabel(pParse);
    int r2, regToFree;
    int regCkNull = 0;
    int ii;
    assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
    if( destIfNull!=destIfFalse ){
      regCkNull = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_BitAnd, rLhs, rLhs, regCkNull);
    }
    for(ii=0; ii<pList->nExpr; ii++){
      r2 = sqlite3ExprCodeTemp(pParse, pList->a[ii].pExpr, &regToFree);
      if( regCkNull && sqlite3ExprCanBeNull(pList->a[ii].pExpr) ){
        sqlite3VdbeAddOp3(v, OP_BitAnd, regCkNull, r2, regCkNull);
      }
      if( ii<pList->nExpr-1 || destIfNull!=destIfFalse ){
        sqlite3VdbeAddOp4(v, OP_Eq, rLhs, labelOk, r2,
                          (void*)pColl, P4_COLLSEQ);
        VdbeCoverageIf(v, ii<pList->nExpr-1);
        VdbeCoverageIf(v, ii==pList->nExpr-1);
        sqlite3VdbeChangeP5(v, zAff[0]);
      }else{
        assert( destIfNull==destIfFalse );
        sqlite3VdbeAddOp4(v, OP_Ne, rLhs, destIfFalse, r2,
                          (void*)pColl, P4_COLLSEQ); VdbeCoverage(v);
        sqlite3VdbeChangeP5(v, zAff[0] | SQLITE_JUMPIFNULL);
      }
      sqlite3ReleaseTempReg(pParse, regToFree);
    }
    if( regCkNull ){
      sqlite3VdbeAddOp2(v, OP_IsNull, regCkNull, destIfNull); VdbeCoverage(v);
      sqlite3VdbeGoto(v, destIfFalse);
    }
    sqlite3VdbeResolveLabel(v, labelOk);
    sqlite3ReleaseTempReg(pParse, regCkNull);
    goto sqlite3ExprCodeIN_finished;
  }

  /* Step 2: Check to see if the LHS contains any NULL columns.  If the
  ** LHS does contain NULLs then the result must be either FALSE or NULL.
  ** We will then skip the binary search of the RHS.
  */
  if( destIfNull==destIfFalse ){
    destStep2 = destIfFalse;
  }else{
    destStep2 = destStep6 = sqlite3VdbeMakeLabel(pParse);
  }
  for(i=0; i<nVector; i++){
    Expr *p = sqlite3VectorFieldSubexpr(pExpr->pLeft, i);
    if( sqlite3ExprCanBeNull(p) ){
      sqlite3VdbeAddOp2(v, OP_IsNull, rLhs+i, destStep2);
      VdbeCoverage(v);
    }
  }

  /* Step 3.  The LHS is now known to be non-NULL.  Do the binary search
  ** of the RHS using the LHS as a probe.  If found, the result is
  ** true.
  */
  if( eType==IN_INDEX_ROWID ){
    /* In this case, the RHS is the ROWID of table b-tree and so we also
    ** know that the RHS is non-NULL.  Hence, we combine steps 3 and 4
    ** into a single opcode. */
    sqlite3VdbeAddOp3(v, OP_SeekRowid, iTab, destIfFalse, rLhs);
    VdbeCoverage(v);
    addrTruthOp = sqlite3VdbeAddOp0(v, OP_Goto);  /* Return True */
  }else{
    sqlite3VdbeAddOp4(v, OP_Affinity, rLhs, nVector, 0, zAff, nVector);
    if( destIfFalse==destIfNull ){
      /* Combine Step 3 and Step 5 into a single opcode */
      sqlite3VdbeAddOp4Int(v, OP_NotFound, iTab, destIfFalse,
                           rLhs, nVector); VdbeCoverage(v);
      goto sqlite3ExprCodeIN_finished;
    }
    /* Ordinary Step 3, for the case where FALSE and NULL are distinct */
    addrTruthOp = sqlite3VdbeAddOp4Int(v, OP_Found, iTab, 0,
                                      rLhs, nVector); VdbeCoverage(v);
  }

  /* Step 4.  If the RHS is known to be non-NULL and we did not find
  ** an match on the search above, then the result must be FALSE.
  */
  if( rRhsHasNull && nVector==1 ){
    sqlite3VdbeAddOp2(v, OP_NotNull, rRhsHasNull, destIfFalse);
    VdbeCoverage(v);
  }

  /* Step 5.  If we do not care about the difference between NULL and
  ** FALSE, then just return false. 
  */
  if( destIfFalse==destIfNull ) sqlite3VdbeGoto(v, destIfFalse);

  /* Step 6: Loop through rows of the RHS.  Compare each row to the LHS.
  ** If any comparison is NULL, then the result is NULL.  If all
  ** comparisons are FALSE then the final result is FALSE.
  **
  ** For a scalar LHS, it is sufficient to check just the first row
  ** of the RHS.
  */
  if( destStep6 ) sqlite3VdbeResolveLabel(v, destStep6);
  addrTop = sqlite3VdbeAddOp2(v, OP_Rewind, iTab, destIfFalse);
  VdbeCoverage(v);
  if( nVector>1 ){
    destNotNull = sqlite3VdbeMakeLabel(pParse);
  }else{
    /* For nVector==1, combine steps 6 and 7 by immediately returning
    ** FALSE if the first comparison is not NULL */
    destNotNull = destIfFalse;
  }
  for(i=0; i<nVector; i++){
    Expr *p;
    CollSeq *pColl;
    int r3 = sqlite3GetTempReg(pParse);
    p = sqlite3VectorFieldSubexpr(pLeft, i);
    pColl = sqlite3ExprCollSeq(pParse, p);
    sqlite3VdbeAddOp3(v, OP_Column, iTab, i, r3);
    sqlite3VdbeAddOp4(v, OP_Ne, rLhs+i, destNotNull, r3,
                      (void*)pColl, P4_COLLSEQ);
    VdbeCoverage(v);
    sqlite3ReleaseTempReg(pParse, r3);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfNull);
  if( nVector>1 ){
    sqlite3VdbeResolveLabel(v, destNotNull);
    sqlite3VdbeAddOp2(v, OP_Next, iTab, addrTop+1);
    VdbeCoverage(v);

    /* Step 7:  If we reach this point, we know that the result must
    ** be false. */
    sqlite3VdbeAddOp2(v, OP_Goto, 0, destIfFalse);
  }

  /* Jumps here in order to return true. */
  sqlite3VdbeJumpHere(v, addrTruthOp);

sqlite3ExprCodeIN_finished:
  if( rLhs!=rLhsOrig ) sqlite3ReleaseTempReg(pParse, rLhs);
  VdbeComment((v, "end IN expr"));
sqlite3ExprCodeIN_oom_error:
  sqlite3DbFree(pParse->db, aiMap);
  sqlite3DbFree(pParse->db, zAff);
}